

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O1

uint ON_DimStyle::Internal_GetSystemDimstyleList
               (ON_SimpleArray<const_ON_DimStyle_*> *system_dimstyle_list)

{
  ON_DimStyle *local_18;
  
  if (-1 < system_dimstyle_list->m_capacity) {
    system_dimstyle_list->m_count = 0;
  }
  if ((uint)system_dimstyle_list->m_capacity < 8) {
    ON_SimpleArray<const_ON_DimStyle_*>::SetCapacity(system_dimstyle_list,8);
  }
  local_18 = &Default;
  ON_SimpleArray<const_ON_DimStyle_*>::Append(system_dimstyle_list,&local_18);
  local_18 = &DefaultInchDecimal;
  ON_SimpleArray<const_ON_DimStyle_*>::Append(system_dimstyle_list,&local_18);
  local_18 = &DefaultInchFractional;
  ON_SimpleArray<const_ON_DimStyle_*>::Append(system_dimstyle_list,&local_18);
  local_18 = &DefaultFootInchArchitecture;
  ON_SimpleArray<const_ON_DimStyle_*>::Append(system_dimstyle_list,&local_18);
  local_18 = &DefaultMillimeterSmall;
  ON_SimpleArray<const_ON_DimStyle_*>::Append(system_dimstyle_list,&local_18);
  local_18 = &DefaultMillimeterLarge;
  ON_SimpleArray<const_ON_DimStyle_*>::Append(system_dimstyle_list,&local_18);
  local_18 = &DefaultMillimeterArchitecture;
  ON_SimpleArray<const_ON_DimStyle_*>::Append(system_dimstyle_list,&local_18);
  return system_dimstyle_list->m_count;
}

Assistant:

unsigned int ON_DimStyle::Internal_GetSystemDimstyleList(
  ON_SimpleArray<const ON_DimStyle*>& system_dimstyle_list
)
{
  system_dimstyle_list.SetCount(0);
  system_dimstyle_list.Reserve(8);
  system_dimstyle_list.Append(&ON_DimStyle::Default);
  system_dimstyle_list.Append(&ON_DimStyle::DefaultInchDecimal);
  system_dimstyle_list.Append(&ON_DimStyle::DefaultInchFractional);
  system_dimstyle_list.Append(&ON_DimStyle::DefaultFootInchArchitecture);
  system_dimstyle_list.Append(&ON_DimStyle::DefaultMillimeterSmall);
  system_dimstyle_list.Append(&ON_DimStyle::DefaultMillimeterLarge);
  system_dimstyle_list.Append(&ON_DimStyle::DefaultMillimeterArchitecture);
  return system_dimstyle_list.UnsignedCount();
}